

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeSetLang(xmlNodePtr cur,xmlChar *lang)

{
  int iVar1;
  xmlAttrPtr pxVar2;
  xmlNsPtr ns;
  
  iVar1 = 1;
  if (cur != (xmlNodePtr)0x0) {
    ns = (xmlNsPtr)0x1;
    if ((cur->type == XML_ELEMENT_NODE) &&
       (iVar1 = xmlSearchNsByHrefSafe(cur,(xmlChar *)"http://www.w3.org/XML/1998/namespace",&ns),
       iVar1 == 0)) {
      pxVar2 = xmlSetNsProp(cur,ns,"lang",lang);
      iVar1 = -(uint)(pxVar2 == (xmlAttrPtr)0x0);
    }
  }
  return iVar1;
}

Assistant:

int
xmlNodeSetLang(xmlNodePtr cur, const xmlChar *lang) {
    xmlNsPtr ns;
    xmlAttrPtr attr;
    int res;

    if ((cur == NULL) || (cur->type != XML_ELEMENT_NODE))
        return(1);

    res = xmlSearchNsByHrefSafe(cur, XML_XML_NAMESPACE, &ns);
    if (res != 0)
        return(res);
    attr = xmlSetNsProp(cur, ns, BAD_CAST "lang", lang);
    if (attr == NULL)
        return(-1);

    return(0);
}